

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void Hex::Hexdumper<char>::output_asc(ostream *os,char *first,char *last)

{
  char cVar1;
  
  for (; first < last; first = first + 1) {
    cVar1 = *first;
    if (0x5e < (byte)(cVar1 - 0x20U)) {
      cVar1 = '.';
    }
    std::operator<<(os,cVar1);
  }
  return;
}

Assistant:

static void output_asc(std::ostream& os, const T*first, const T*last)
    {
        const uint8_t* p = (const uint8_t*)first;
        while (p < (const uint8_t*)last)
        {
            char c = *p;
            os << (isprintable(c) ? c : '.');

            ++p;
        }
    }